

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O3

void plain_array_suite::remove_back(void)

{
  ulong uVar1;
  basic_iterator<int> first_end;
  basic_iterator<int> first_end_00;
  basic_iterator<int> first_end_01;
  basic_iterator<int> first_end_02;
  basic_iterator<int> first_end_03;
  basic_iterator<int> first_end_04;
  reference piVar2;
  ulong uVar3;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  basic_iterator<int> first_begin;
  basic_iterator<int> first_begin_00;
  basic_iterator<int> first_begin_01;
  basic_iterator<int> first_begin_02;
  basic_iterator<int> first_begin_03;
  basic_iterator<int> first_begin_04;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  allocator_type local_c1;
  vector<int,_std::allocator<int>_> local_c0;
  circular_view<int,_18446744073709551615UL> local_a8;
  int local_88 [4];
  circular_view<int,_18446744073709551615UL> *local_78;
  size_type sStack_70;
  circular_view<int,_18446744073709551615UL> *local_68;
  size_type sStack_60;
  circular_view<int,_18446744073709551615UL> *local_58;
  size_type sStack_50;
  circular_view<int,_18446744073709551615UL> *local_48;
  size_type sStack_40;
  circular_view<int,_18446744073709551615UL> *local_38;
  size_type sStack_30;
  circular_view<int,_18446744073709551615UL> *local_28;
  size_type sStack_20;
  type local_18 [4];
  
  local_a8.member.data = local_18;
  local_18[0] = 0;
  local_18[1] = 0;
  local_18[2] = 0;
  local_18[3] = 0;
  local_a8.member.cap = 4;
  local_a8.member.size = 0;
  local_a8.member.next = 4;
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_a8,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_a8);
  *piVar2 = 0xb;
  local_88[0] = 0xb;
  __l._M_len = 1;
  __l._M_array = local_88;
  std::vector<int,_std::allocator<int>_>::vector(&local_c0,__l,&local_c1);
  uVar1 = local_a8.member.cap * 2;
  if ((uVar1 & local_a8.member.cap * 2 - 1) == 0) {
    uVar3 = local_a8.member.next - local_a8.member.size & uVar1 - 1;
    sStack_20 = uVar1 - 1 & local_a8.member.next;
  }
  else {
    uVar3 = (local_a8.member.next - local_a8.member.size) % uVar1;
    sStack_20 = local_a8.member.next % uVar1;
  }
  first_end.current = sStack_20;
  first_end.parent = &local_a8;
  first_begin.current = uVar3;
  first_begin.parent = &local_a8;
  local_28 = &local_a8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x6c6,"void plain_array_suite::remove_back()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::remove_back(&local_a8,1);
  uVar1 = local_a8.member.cap * 2;
  if ((uVar1 & local_a8.member.cap * 2 - 1) == 0) {
    uVar3 = local_a8.member.next - local_a8.member.size & uVar1 - 1;
    sStack_30 = uVar1 - 1 & local_a8.member.next;
  }
  else {
    uVar3 = (local_a8.member.next - local_a8.member.size) % uVar1;
    sStack_30 = local_a8.member.next % uVar1;
  }
  first_end_00.current = sStack_30;
  first_end_00.parent = &local_a8;
  first_begin_00.current = uVar3;
  first_begin_00.parent = &local_a8;
  local_38 = &local_a8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x6cc,"void plain_array_suite::remove_back()",first_begin_00,first_end_00,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)0x0,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)0x0);
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_a8,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_a8);
  *piVar2 = 0xb;
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_a8,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_a8);
  *piVar2 = 0x16;
  local_88[0] = 0xb;
  local_88[1] = 0x16;
  __l_00._M_len = 2;
  __l_00._M_array = local_88;
  std::vector<int,_std::allocator<int>_>::vector(&local_c0,__l_00,&local_c1);
  uVar1 = local_a8.member.cap * 2;
  if ((uVar1 & local_a8.member.cap * 2 - 1) == 0) {
    uVar3 = local_a8.member.next - local_a8.member.size & uVar1 - 1;
    sStack_40 = uVar1 - 1 & local_a8.member.next;
  }
  else {
    uVar3 = (local_a8.member.next - local_a8.member.size) % uVar1;
    sStack_40 = local_a8.member.next % uVar1;
  }
  first_end_01.current = sStack_40;
  first_end_01.parent = &local_a8;
  first_begin_01.current = uVar3;
  first_begin_01.parent = &local_a8;
  local_48 = &local_a8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x6d3,"void plain_array_suite::remove_back()",first_begin_01,first_end_01,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::remove_back(&local_a8,1);
  local_88[0] = 0xb;
  __l_01._M_len = 1;
  __l_01._M_array = local_88;
  std::vector<int,_std::allocator<int>_>::vector(&local_c0,__l_01,&local_c1);
  uVar1 = local_a8.member.cap * 2;
  if ((uVar1 & local_a8.member.cap * 2 - 1) == 0) {
    uVar3 = local_a8.member.next - local_a8.member.size & uVar1 - 1;
    sStack_50 = uVar1 - 1 & local_a8.member.next;
  }
  else {
    uVar3 = (local_a8.member.next - local_a8.member.size) % uVar1;
    sStack_50 = local_a8.member.next % uVar1;
  }
  first_end_02.current = sStack_50;
  first_end_02.parent = &local_a8;
  first_begin_02.current = uVar3;
  first_begin_02.parent = &local_a8;
  local_58 = &local_a8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x6d9,"void plain_array_suite::remove_back()",first_begin_02,first_end_02,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_a8,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_a8);
  *piVar2 = 0x21;
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_a8,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_a8);
  *piVar2 = 0x2c;
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_a8,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_a8);
  *piVar2 = 0x37;
  local_88[0] = 0xb;
  local_88[1] = 0x21;
  local_88[2] = 0x2c;
  local_88[3] = 0x37;
  __l_02._M_len = 4;
  __l_02._M_array = local_88;
  std::vector<int,_std::allocator<int>_>::vector(&local_c0,__l_02,&local_c1);
  uVar1 = local_a8.member.cap * 2;
  if ((uVar1 & local_a8.member.cap * 2 - 1) == 0) {
    uVar3 = local_a8.member.next - local_a8.member.size & uVar1 - 1;
    sStack_60 = uVar1 - 1 & local_a8.member.next;
  }
  else {
    uVar3 = (local_a8.member.next - local_a8.member.size) % uVar1;
    sStack_60 = local_a8.member.next % uVar1;
  }
  first_end_03.current = sStack_60;
  first_end_03.parent = &local_a8;
  first_begin_03.current = uVar3;
  first_begin_03.parent = &local_a8;
  local_68 = &local_a8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x6e1,"void plain_array_suite::remove_back()",first_begin_03,first_end_03,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::remove_back(&local_a8,1);
  local_88[0] = 0xb;
  local_88[1] = 0x21;
  local_88[2] = 0x2c;
  __l_03._M_len = 3;
  __l_03._M_array = local_88;
  std::vector<int,_std::allocator<int>_>::vector(&local_c0,__l_03,&local_c1);
  uVar1 = local_a8.member.cap * 2;
  if ((uVar1 & local_a8.member.cap * 2 - 1) == 0) {
    uVar3 = local_a8.member.next - local_a8.member.size & uVar1 - 1;
    sStack_70 = uVar1 - 1 & local_a8.member.next;
  }
  else {
    uVar3 = (local_a8.member.next - local_a8.member.size) % uVar1;
    sStack_70 = local_a8.member.next % uVar1;
  }
  first_end_04.current = sStack_70;
  first_end_04.parent = &local_a8;
  first_begin_04.current = uVar3;
  first_begin_04.parent = &local_a8;
  local_78 = &local_a8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x6e7,"void plain_array_suite::remove_back()",first_begin_04,first_end_04,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void remove_back()
{
    int array[4] = {};
    circular_view<int> span(array);
    span.push_back(11);
    {
        std::vector<int> expect = { 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.remove_back();
    {
        std::vector<int> expect = { };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_back(11);
    span.push_back(22);
    {
        std::vector<int> expect = { 11, 22 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.remove_back();
    {
        std::vector<int> expect = { 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_back(33);
    span.push_back(44);
    span.push_back(55);
    {
        std::vector<int> expect = { 11, 33, 44, 55 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.remove_back();
    {
        std::vector<int> expect = { 11, 33, 44 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}